

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

string * __thiscall
cfd::TransactionContext::GetTxOutAddress(TransactionContext *this,uint32_t index,NetType net_type)

{
  size_type sVar1;
  undefined8 uVar2;
  uint in_EDX;
  long in_RSI;
  string *in_RDI;
  AddressFactory address_factory;
  Script *in_stack_00000110;
  AddressFactory *in_stack_00000118;
  undefined8 in_stack_ffffffffffffff28;
  NetType type;
  Script *in_stack_ffffffffffffff30;
  allocator *paVar3;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff50;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  
  type = (NetType)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_14 = in_EDX;
  sVar1 = std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::size
                    ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)(in_RSI + 0x28))
  ;
  if (sVar1 <= local_14) {
    uVar2 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)in_RSI >> 0x20);
    paVar3 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"vout out_of_range error.",paVar3);
    core::CfdException::CfdException(in_stack_ffffffffffffff50,error_code,in_RDI);
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  AddressFactory::AddressFactory((AddressFactory *)in_stack_ffffffffffffff30,type);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)(in_RSI + 0x28),
             (ulong)local_14);
  cfd::core::AbstractTxOut::GetLockingScript();
  AddressFactory::GetAddressByLockingScript(in_stack_00000118,in_stack_00000110);
  core::Script::~Script(in_stack_ffffffffffffff30);
  AddressFactory::~AddressFactory((AddressFactory *)0x3ad986);
  return in_RDI;
}

Assistant:

Address TransactionContext::GetTxOutAddress(
    uint32_t index, NetType net_type) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  AddressFactory address_factory(net_type);
  return address_factory.GetAddressByLockingScript(
      vout_[index].GetLockingScript());
}